

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O3

void __thiscall RationalNum::setDenominator(RationalNum *this,longlong denominator_)

{
  if (denominator_ != 0) {
    this->denominator = denominator_;
    return;
  }
  this->denominator = 1;
  this->numerator = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Denominator is 0! Not good! THe whole is set to 0.",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void RationalNum::setDenominator(long long int denominator_) {
    if (denominator_ == 0) {
        denominator = 1;
        numerator = 0;
        cout << "Denominator is 0! Not good! THe whole is set to 0." << endl;
    } else {
        denominator = denominator_;
    }
}